

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

void __thiscall xray_re::xr_reader::r_s(xr_reader *this,string *value)

{
  uchar *__first;
  uchar *puVar1;
  uchar *puVar2;
  uchar *__last;
  uint8_t *puVar3;
  
  __first = (this->field_2).m_p;
  puVar1 = this->m_end;
  puVar2 = __first;
  if (__first < puVar1) {
    for (; ((__last = puVar1, puVar2 != puVar1 && (__last = puVar2, *puVar2 != '\n')) &&
           (*puVar2 != '\r')); puVar2 = puVar2 + 1) {
    }
    std::__cxx11::string::assign<unsigned_char_const*,void>((string *)value,__first,__last);
    for (; (puVar3 = this->m_end, __last != this->m_end &&
           ((*__last == '\r' || (puVar3 = __last, *__last == '\n')))); __last = __last + 1) {
    }
    (this->field_2).m_p = puVar3;
    return;
  }
  __assert_fail("p < m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                ,0x7f,"void xray_re::xr_reader::r_s(std::string &)");
}

Assistant:

void xr_reader::r_s(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (p != m_end && *p != '\n' && *p != '\r')
		++p;
	value.assign(m_p, p);
	while (p != m_end && (*p == '\n' || *p == '\r'))
		++p;
	m_p = p;
}